

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O0

int flatcc_builder_start_vector
              (flatcc_builder_t *B,size_t elem_size,uint16_t align,size_t max_count)

{
  int iVar1;
  size_t max_count_local;
  size_t sStack_20;
  uint16_t align_local;
  size_t elem_size_local;
  flatcc_builder_t *B_local;
  
  max_count_local._6_2_ = align;
  sStack_20 = elem_size;
  elem_size_local = (size_t)B;
  get_min_align((uint16_t *)((long)&max_count_local + 6),4);
  iVar1 = enter_frame((flatcc_builder_t *)elem_size_local,max_count_local._6_2_);
  if (iVar1 == 0) {
    *(int *)(*(long *)(elem_size_local + 0x30) + 0x10) = (int)sStack_20;
    *(undefined4 *)(*(long *)(elem_size_local + 0x30) + 0x14) = 0;
    *(int *)(*(long *)(elem_size_local + 0x30) + 0x18) = (int)max_count;
    *(undefined2 *)(*(long *)(elem_size_local + 0x30) + 0xe) = 4;
    refresh_ds((flatcc_builder_t *)elem_size_local,0xfffffffc);
    B_local._4_4_ = 0;
  }
  else {
    B_local._4_4_ = -1;
  }
  return B_local._4_4_;
}

Assistant:

int flatcc_builder_start_vector(flatcc_builder_t *B, size_t elem_size, uint16_t align, size_t max_count)
{
    get_min_align(&align, field_size);
    if (enter_frame(B, align)) {
        return -1;
    }
    frame(container.vector.elem_size) = (uoffset_t)elem_size;
    frame(container.vector.count) = 0;
    frame(container.vector.max_count) = (uoffset_t)max_count;
    frame(type) = flatcc_builder_vector;
    refresh_ds(B, data_limit);
    return 0;
}